

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O1

void __thiscall EefcFlash::waitFSR(EefcFlash *this,int seconds)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined8 *puVar5;
  pointer_____offset_0x10___ *ppuVar6;
  uint uVar7;
  
  if (0 < seconds) {
    uVar7 = seconds * 1000;
    uVar1 = uVar7 - 1;
    uVar4 = 1;
    do {
      uVar3 = Samba::readWord((this->super_Flash)._samba,*(int *)&(this->super_Flash).field_0xf4 + 8
                             );
      if ((uVar3 & 2) != 0) {
LAB_0010e1a7:
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = &PTR__exception_001197c8;
        ppuVar6 = &FlashCmdError::typeinfo;
        goto LAB_0010e1df;
      }
      if ((uVar3 & 4) != 0) {
LAB_0010e1c4:
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = &PTR__exception_00119a30;
        ppuVar6 = &FlashLockError::typeinfo;
        goto LAB_0010e1df;
      }
      if ((this->super_Flash)._planes == 2) {
        uVar4 = Samba::readWord((this->super_Flash)._samba,
                                *(int *)&(this->super_Flash).field_0xf4 + 0x208);
        if ((uVar4 & 2) != 0) goto LAB_0010e1a7;
        if ((uVar4 & 4) != 0) goto LAB_0010e1c4;
      }
      uVar2 = uVar7;
      if ((uVar3 & uVar4 & 1) != 0) break;
      usleep(1000);
      uVar7 = uVar7 - 1;
      uVar2 = (int)uVar1 >> 0x1f & uVar1;
    } while (0 < (int)uVar7);
    if (uVar2 == 1) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = &PTR__exception_00119a58;
      ppuVar6 = &FlashTimeoutError::typeinfo;
LAB_0010e1df:
      __cxa_throw(puVar5,ppuVar6,std::exception::~exception);
    }
  }
  return;
}

Assistant:

void
EefcFlash::waitFSR(int seconds)
{
    int tries = seconds * 1000;
    uint32_t fsr0;
    uint32_t fsr1 = 0x1;

    while (tries-- > 0)
    {
        fsr0 = _samba.readWord(EEFC0_FSR);
        if (fsr0 & 0x2)
            throw FlashCmdError();
        if (fsr0 & 0x4)
            throw FlashLockError();

        if (_planes == 2)
        {
            fsr1 = _samba.readWord(EEFC1_FSR);
            if (fsr1 & 0x2)
                throw FlashCmdError();
            if (fsr1 & 0x4)
                throw FlashLockError();
        }
        if (fsr0 & fsr1 & 0x1)
            break;
        usleep(1000);
    }
    if (tries == 0)
        throw FlashTimeoutError();
}